

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::StreamingConcatenationExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,StreamingConcatenationExpressionSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  SyntaxNode *local_90;
  size_t index_local;
  StreamingConcatenationExpressionSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->openBrace).kind;
    token._2_1_ = (this->openBrace).field_0x2;
    token.numFlags.raw = (this->openBrace).numFlags.raw;
    token.rawLen = (this->openBrace).rawLen;
    token.info = (this->openBrace).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->operatorToken).kind;
    token_00._2_1_ = (this->operatorToken).field_0x2;
    token_00.numFlags.raw = (this->operatorToken).numFlags.raw;
    token_00.rawLen = (this->operatorToken).rawLen;
    token_00.info = (this->operatorToken).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->sliceSize->super_SyntaxNode);
    break;
  case 3:
    token_01.kind = (this->innerOpenBrace).kind;
    token_01._2_1_ = (this->innerOpenBrace).field_0x2;
    token_01.numFlags.raw = (this->innerOpenBrace).numFlags.raw;
    token_01.rawLen = (this->innerOpenBrace).rawLen;
    token_01.info = (this->innerOpenBrace).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    local_90 = (SyntaxNode *)0x0;
    if (this != (StreamingConcatenationExpressionSyntax *)0xffffffffffffffb8) {
      local_90 = &(this->expressions).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_90);
    break;
  case 5:
    token_02.kind = (this->innerCloseBrace).kind;
    token_02._2_1_ = (this->innerCloseBrace).field_0x2;
    token_02.numFlags.raw = (this->innerCloseBrace).numFlags.raw;
    token_02.rawLen = (this->innerCloseBrace).rawLen;
    token_02.info = (this->innerCloseBrace).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 6:
    token_03.kind = (this->closeBrace).kind;
    token_03._2_1_ = (this->closeBrace).field_0x2;
    token_03.numFlags.raw = (this->closeBrace).numFlags.raw;
    token_03.rawLen = (this->closeBrace).rawLen;
    token_03.info = (this->closeBrace).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax StreamingConcatenationExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openBrace;
        case 1: return operatorToken;
        case 2: return sliceSize;
        case 3: return innerOpenBrace;
        case 4: return &expressions;
        case 5: return innerCloseBrace;
        case 6: return closeBrace;
        default: return nullptr;
    }
}